

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O2

void __thiscall wasm::Flatten::visitFunction(Flatten *this,Function *curr)

{
  Return *preluder;
  Return *after;
  Expression *pEVar1;
  FeaturePolicy in_ECX;
  
  preluder = (Return *)curr->body;
  after = preluder;
  if (1 < (preluder->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression.type.id) {
    after = MixedArena::alloc<wasm::Return>
                      (&((this->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .
                         super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        .currModule)->allocator);
    after->value = (Expression *)preluder;
    curr->body = (Expression *)after;
  }
  pEVar1 = getPreludesWithExpression(this,(Expression *)preluder,(Expression *)after);
  curr->body = pEVar1;
  EHUtils::handleBlockNestedPops
            ((EHUtils *)curr,
             (Function *)
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
             ).
             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
             .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
             super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
             currModule,(Module *)0x0,in_ECX);
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto* originalBody = curr->body;
    // if the body is a block with a result, turn that into a return
    if (curr->body->type.isConcrete()) {
      curr->body = Builder(*getModule()).makeReturn(curr->body);
    }
    // the body may have preludes
    curr->body = getPreludesWithExpression(originalBody, curr->body);

    // Flatten can generate blocks within 'catch', making pops invalid. Fix them
    // up.
    EHUtils::handleBlockNestedPops(curr, *getModule());
  }